

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int str_hash(st_data_t astring)

{
  int local_20;
  int val;
  int c;
  char *string;
  st_data_t astring_local;
  
  local_20 = 0;
  _val = (char *)astring;
  while( true ) {
    if (*_val == 0) break;
    local_20 = local_20 * 0x3e5 + (int)*_val;
    _val = _val + 1;
  }
  return local_20 + (local_20 >> 5);
}

Assistant:

static int
str_hash(st_data_t astring)
{
  const char* string = (const char* )astring;
  register int c;

#ifdef HASH_ELFHASH
  register unsigned int h = 0, g;

  while ((c = *string++) != '\0') {
    h = ( h << 4 ) + c;
    if ( g = h & 0xF0000000 )
	    h ^= g >> 24;
    h &= ~g;
  }
  return h;
#elif HASH_PERL
  register int val = 0;

  while ((c = *string++) != '\0') {
    val += c;
    val += (val << 10);
    val ^= (val >> 6);
  }
  val += (val << 3);
  val ^= (val >> 11);

  return val + (val << 15);
#else
  register int val = 0;

  while ((c = *string++) != '\0') {
    val = val*997 + c;
  }

  return val + (val>>5);
#endif
}